

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

FuncInfo * __thiscall ByteCodeGenerator::GetEnclosingFuncInfo(ByteCodeGenerator *this)

{
  RealCount *pRVar1;
  Type pFVar2;
  Type pFVar3;
  code *pcVar4;
  bool bVar5;
  Type *ppFVar6;
  undefined4 *puVar7;
  Type pSVar8;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar9;
  
  pSVar9 = this->funcInfoStack;
  ppFVar6 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&pSVar9->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar2 = *ppFVar6;
  SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&pSVar9->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>,
             pSVar9->allocator);
  pSVar9 = this->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar9->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x746,"(!this->funcInfoStack->Empty())","!this->funcInfoStack->Empty()");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
    pSVar9 = this->funcInfoStack;
  }
  ppFVar6 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&pSVar9->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar3 = *ppFVar6;
  pSVar9 = this->funcInfoStack;
  pSVar8 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar9->allocator,0x364470);
  pSVar8[1].next = (Type)pFVar2;
  pSVar8->next = (pSVar9->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pSVar9->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar8;
  pRVar1 = &(pSVar9->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount
  ;
  pRVar1->count = pRVar1->count + 1;
  return pFVar3;
}

Assistant:

FuncInfo* ByteCodeGenerator::GetEnclosingFuncInfo()
{
    FuncInfo* top = this->funcInfoStack->Pop();

    Assert(!this->funcInfoStack->Empty());

    FuncInfo* second = this->funcInfoStack->Top();

    this->funcInfoStack->Push(top);

    return second;
}